

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.hpp
# Opt level: O0

void __thiscall baryonyx::pnm_vector::pnm_vector(pnm_vector *this,string *filename,uint m,long loop)

{
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *this_00;
  byte bVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  string_view format_str;
  undefined1 local_114 [4];
  undefined1 local_110 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> header;
  long loop_local;
  uint m_local;
  string *filename_local;
  pnm_vector *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_b0;
  basic_string_view<char> local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_long,_int>
  local_98;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_long,_int>
  *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_long,_int>
  *vargs;
  long *local_50;
  long *local_48;
  char *local_40;
  undefined1 *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_long,_int>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_long,_int>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_long,_int>
  *local_10;
  
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)this);
  std::ofstream::ofstream(&this->m_ofs,(string *)filename,_S_bin);
  this->m_heigth = loop;
  this->m_width = (ulong)m;
  bVar1 = std::ofstream::is_open();
  if (((bVar1 & 1) != 0) && (0 < this->m_heigth * this->m_width)) {
    size(this);
    std::make_unique<unsigned_char[]>((size_t)((long)&header.field_2 + 8));
    this_00 = (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
              ((long)&header.field_2 + 8);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
              (&this->m_buffer,this_00);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(this_00);
    local_48 = &this->m_width;
    local_50 = &this->m_heigth;
    local_114 = (undefined1  [4])0xff;
    local_38 = local_110;
    local_40 = "P6 {} {} {} ";
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_long,_int>
             *)local_114;
    ::fmt::v7::make_args_checked<long&,long&,int,char[13],char>
              (&local_98,(v7 *)"P6 {} {} {} ",(char (*) [13])local_48,local_50,
               (remove_reference_t<long_&> *)vargs,(remove_reference_t<int> *)in_R9.values_);
    local_60 = &local_98;
    local_a8 = ::fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_30 = local_60;
    local_20 = local_60;
    local_10 = local_60;
    local_18 = local_28;
    ::fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0x133,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_60);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_b0.values_;
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_a8.size_;
    ::fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_110,(detail *)local_a8.data_,format_str,args);
    std::operator<<((ostream *)&this->m_ofs,(string *)local_110);
    std::__cxx11::string::~string((string *)local_110);
  }
  return;
}

Assistant:

pnm_vector(std::string filename, unsigned int m, long int loop)
      : m_ofs(filename, std::ios::binary)
      , m_heigth(loop)
      , m_width(m)
    {
        if (!m_ofs.is_open())
            return;

        if (m_heigth * m_width > 0) {
            m_buffer = std::make_unique<std::uint8_t[]>(size());

            auto header{ fmt::format("P6 {} {} {} ", m_width, m_heigth, 255) };
            m_ofs << header;
        }
    }